

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void testWriteRead(pixels *p,string *tempdir,exr_compression_t comp,char *pattern)

{
  int ys;
  int ys_00;
  int xs;
  int xs_00;
  allocator<char> local_b1;
  string cppfilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string filename;
  
  std::operator+(&cppfilename,tempdir,pattern);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"_imf_test_comp.exr",(allocator<char> *)&local_70);
  std::operator+(&filename,&cppfilename,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&cppfilename);
  std::operator+(&local_90,tempdir,pattern);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"_imf_test_comp_cpp.exr",&local_b1);
  std::operator+(&cppfilename,&local_90,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  for (xs_00 = 1; xs_00 != 3; xs_00 = xs_00 + 1) {
    for (ys_00 = 1; ys_00 != 3; ys_00 = ys_00 + 1) {
      doWriteRead(p,&filename,&cppfilename,false,xs_00,ys_00,comp,pattern);
      if (ys_00 == 1 && xs_00 == 1) {
        doWriteRead(p,&filename,&cppfilename,true,1,1,comp,pattern);
      }
    }
  }
  std::__cxx11::string::~string((string *)&cppfilename);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

static void
testWriteRead (
    pixels&            p,
    const std::string& tempdir,
    exr_compression_t  comp,
    const char*        pattern)
{
    std::string filename =
        tempdir + pattern + std::string ("_imf_test_comp.exr");
    std::string cppfilename =
        tempdir + pattern + std::string ("_imf_test_comp_cpp.exr");
    const int maxsampling = 2;
    for (int xs = 1; xs <= maxsampling; ++xs)
    {
        for (int ys = 1; ys <= maxsampling; ++ys)
        {
            doWriteRead (
                p, filename, cppfilename, false, xs, ys, comp, pattern);
            if (xs == 1 && ys == 1)
                doWriteRead (
                    p, filename, cppfilename, true, xs, ys, comp, pattern);
        }
    }
}